

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterReader.cpp
# Opt level: O2

double __thiscall ParameterReader::getVal(ParameterReader *this,string *name,double defaultValue)

{
  long lVar1;
  ostream *poVar2;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)name);
  lVar1 = _find(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (lVar1 == -1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "ParameterReader::getVal error: parameter with name ");
    poVar2 = std::operator<<(poVar2,(string *)name);
    poVar2 = std::operator<<(poVar2," not found.");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"using defaultValue: ");
    poVar2 = std::ostream::_M_insert<double>(defaultValue);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    defaultValue = (this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar1];
  }
  return defaultValue;
}

Assistant:

double ParameterReader::getVal(string name, double defaultValue) const {
    long idx = _find(name);
    if (idx != -1) {
        return values[idx];
    } else {
        cout << "ParameterReader::getVal error: parameter with name " << name
             << " not found." << endl;
        cout << "using defaultValue: " << defaultValue << endl;
        return (defaultValue);
    }
}